

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O1

Maybe<kj::Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>_> *
kj::parse::
Many_<kj::parse::Sequence_<const_kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::IdentifierToString>_&,_kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'['>,_const_kj::parse::Sequence_<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'0'>,_kj::parse::ExactlyConst_<char,_'x'>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_true>_>,_kj::parse::_::ParseInteger<16U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'0'>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<8U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<10U>_>_>,_kj::parse::NotLookingAt_<kj::parse::CharGroup_>_>_&,_kj::parse::ExactlyConst_<char,_']'>_>,_false>,_kj::parse::OneOf_<const_kj::parse::EndOfInput__&,_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'.'>,_kj::parse::NotLookingAt_<const_kj::parse::EndOfInput__&>_>_>_>,_false>
::
Impl<kj::parse::IteratorInput<char,_const_char_*>,_kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>
::apply(Maybe<kj::Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>_>
        *__return_storage_ptr__,
       Sequence_<const_kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::IdentifierToString>_&,_kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__[_>,_const_kj::parse::Sequence_<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::ExactlyConst_<char,__x_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_true>_>,_kj::parse::_::ParseInteger<16U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<8U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<10U>_>_>,_kj::parse::NotLookingAt_<kj::parse::CharGroup_>_>_&,_kj::parse::ExactlyConst_<char,__]_>_>,_false>,_kj::parse::OneOf_<const_kj::parse::EndOfInput__&,_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::NotLookingAt_<const_kj::parse::EndOfInput__&>_>_>_>
       *subParser,IteratorInput<char,_const_char_*> *input)

{
  unsigned_long *puVar1;
  bool bVar2;
  char *pcVar3;
  size_t sVar4;
  Results results;
  NullableValue<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> subResult;
  IteratorInput<char,_const_char_*> subInput;
  Vector<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> local_e8;
  char local_c8;
  char *local_c0;
  size_t sStack_b8;
  ArrayDisposer *pAStack_b0;
  unsigned_long *local_a8;
  size_t sStack_a0;
  ArrayDisposer *pAStack_98;
  IteratorInput<char,_const_char_*> local_90;
  Maybe<kj::Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>_> *local_70;
  Maybe<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> local_68;
  
  local_e8.builder.ptr = (Tuple<kj::String,_kj::Array<unsigned_long>_> *)0x0;
  local_e8.builder.pos = (Tuple<kj::String,_kj::Array<unsigned_long>_> *)0x0;
  local_e8.builder.endPtr = (Tuple<kj::String,_kj::Array<unsigned_long>_> *)0x0;
  local_70 = __return_storage_ptr__;
  do {
    pcVar3 = input->pos;
    if (pcVar3 == input->end) break;
    local_90.parent = input;
    local_90.pos = pcVar3;
    local_90.end = input->end;
    local_90.best = pcVar3;
    Sequence_<const_kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::IdentifierToString>_&,_kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'['>,_const_kj::parse::Sequence_<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'0'>,_kj::parse::ExactlyConst_<char,_'x'>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_true>_>,_kj::parse::_::ParseInteger<16U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'0'>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<8U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<10U>_>_>,_kj::parse::NotLookingAt_<kj::parse::CharGroup_>_>_&,_kj::parse::ExactlyConst_<char,_']'>_>,_false>,_kj::parse::OneOf_<const_kj::parse::EndOfInput__&,_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'.'>,_kj::parse::NotLookingAt_<const_kj::parse::EndOfInput__&>_>_>_>
    ::parseNext<kj::parse::IteratorInput<char,_const_char_*>_>(&local_68,subParser,&local_90);
    bVar2 = local_68.ptr.isSet;
    local_c8 = local_68.ptr.isSet;
    if (local_68.ptr.isSet == true) {
      local_c0 = local_68.ptr.field_1.value.impl.super_TupleElement<0U,_kj::String>.value.content.
                 ptr;
      sStack_b8 = local_68.ptr.field_1.value.impl.super_TupleElement<0U,_kj::String>.value.content.
                  size_;
      pAStack_b0 = local_68.ptr.field_1.value.impl.super_TupleElement<0U,_kj::String>.value.content.
                   disposer;
      local_68.ptr.field_1.value.impl.super_TupleElement<0U,_kj::String>.value.content.ptr =
           (char *)0x0;
      local_68.ptr.field_1.value.impl.super_TupleElement<0U,_kj::String>.value.content.size_ = 0;
      local_a8 = local_68.ptr.field_1.value.impl.super_TupleElement<1U,_kj::Array<unsigned_long>_>.
                 value.ptr;
      sStack_a0 = local_68.ptr.field_1.value.impl.super_TupleElement<1U,_kj::Array<unsigned_long>_>.
                  value.size_;
      pAStack_98 = local_68.ptr.field_1.value.impl.super_TupleElement<1U,_kj::Array<unsigned_long>_>
                   .value.disposer;
      local_68.ptr.field_1.value.impl.super_TupleElement<1U,_kj::Array<unsigned_long>_>.value.ptr =
           (unsigned_long *)0x0;
      local_68.ptr.field_1.value.impl.super_TupleElement<1U,_kj::Array<unsigned_long>_>.value.size_
           = 0;
      (local_90.parent)->pos = local_90.pos;
      if (local_e8.builder.pos == local_e8.builder.endPtr) {
        sVar4 = ((long)local_e8.builder.endPtr - (long)local_e8.builder.ptr >> 4) *
                0x5555555555555556;
        if (local_e8.builder.endPtr == local_e8.builder.ptr) {
          sVar4 = 4;
        }
        Vector<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>::setCapacity(&local_e8,sVar4);
      }
      ((local_e8.builder.pos)->impl).super_TupleElement<0U,_kj::String>.value.content.ptr = local_c0
      ;
      ((local_e8.builder.pos)->impl).super_TupleElement<0U,_kj::String>.value.content.size_ =
           sStack_b8;
      ((local_e8.builder.pos)->impl).super_TupleElement<0U,_kj::String>.value.content.disposer =
           pAStack_b0;
      local_c0 = (char *)0x0;
      sStack_b8 = 0;
      ((local_e8.builder.pos)->impl).super_TupleElement<1U,_kj::Array<unsigned_long>_>.value.ptr =
           local_a8;
      ((local_e8.builder.pos)->impl).super_TupleElement<1U,_kj::Array<unsigned_long>_>.value.size_ =
           sStack_a0;
      ((local_e8.builder.pos)->impl).super_TupleElement<1U,_kj::Array<unsigned_long>_>.value.
      disposer = pAStack_98;
      local_a8 = (unsigned_long *)0x0;
      sStack_a0 = 0;
      local_e8.builder.pos = local_e8.builder.pos + 1;
    }
    sVar4 = sStack_a0;
    puVar1 = local_a8;
    if (local_c8 == '\x01') {
      if (local_a8 != (unsigned_long *)0x0) {
        local_a8 = (unsigned_long *)0x0;
        sStack_a0 = 0;
        (**pAStack_98->_vptr_ArrayDisposer)(pAStack_98,puVar1,8,sVar4,sVar4);
      }
      sVar4 = sStack_b8;
      pcVar3 = local_c0;
      if (local_c0 != (char *)0x0) {
        local_c0 = (char *)0x0;
        sStack_b8 = 0;
        (**pAStack_b0->_vptr_ArrayDisposer)(pAStack_b0,pcVar3,1,sVar4,sVar4);
      }
    }
    if (local_90.parent != (IteratorInput<char,_const_char_*> *)0x0) {
      pcVar3 = local_90.best;
      if (local_90.best < local_90.pos) {
        pcVar3 = local_90.pos;
      }
      if (pcVar3 <= (local_90.parent)->best) {
        pcVar3 = (local_90.parent)->best;
      }
      (local_90.parent)->best = pcVar3;
    }
  } while (bVar2 != false);
  if (local_e8.builder.pos != local_e8.builder.endPtr) {
    Vector<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>::setCapacity
              (&local_e8,
               ((long)local_e8.builder.pos - (long)local_e8.builder.ptr >> 4) * -0x5555555555555555)
    ;
  }
  (local_70->ptr).isSet = true;
  (local_70->ptr).field_1.value.ptr = local_e8.builder.ptr;
  (local_70->ptr).field_1.value.size_ =
       ((long)local_e8.builder.pos - (long)local_e8.builder.ptr >> 4) * -0x5555555555555555;
  (local_70->ptr).field_1.value.disposer = local_e8.builder.disposer;
  return local_70;
}

Assistant:

static Maybe<Array<Output>> apply(const SubParser& subParser, Input& input) {
    typedef Vector<OutputType<SubParser, Input>> Results;
    Results results;

    while (!input.atEnd()) {
      Input subInput(input);

      KJ_IF_MAYBE(subResult, subParser(subInput)) {
        subInput.advanceParent();
        results.add(kj::mv(*subResult));
      } else {
        break;
      }
    }